

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::TableImport::~TableImport(TableImport *this)

{
  (this->super_ImportMixin<(wabt::ExternalKind)1>).super_Import._vptr_Import =
       (_func_int **)&PTR__TableImport_013e1568;
  std::__cxx11::string::~string((string *)&this->table);
  Import::~Import((Import *)this);
  return;
}

Assistant:

explicit TableImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Table>(), table(name) {}